

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::ThreadI2PAcceptIncoming(CConnman *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  anon_class_16_2_853cfe4a SleepOnFailure;
  seconds err_wait;
  direct_or_indirect local_150 [2];
  CAddress local_128;
  CService local_f0;
  CAddress local_c8;
  Connection conn;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  err_wait.__r = 1;
  i2p::Connection::Connection(&conn);
  bVar2 = false;
  SleepOnFailure.this = this;
  SleepOnFailure.err_wait = &err_wait;
  while( true ) {
    bVar3 = CThreadInterrupt::operator_cast_to_bool(&this->interruptNet);
    if (bVar3) break;
    bVar3 = i2p::sam::Session::Listen
                      ((this->m_i2p_sam_session)._M_t.
                       super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                       .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl,&conn);
    if (bVar3) {
      if (!bVar2) {
        bVar2 = true;
        AddLocal(&conn.me,4);
      }
      bVar3 = i2p::sam::Session::Accept
                        ((this->m_i2p_sam_session)._M_t.
                         super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>
                         .super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl,&conn);
      if (bVar3) {
        CService::CService(&local_f0,&conn.me);
        ipIn.super_CNetAddr.m_addr._union._8_8_ = SleepOnFailure.err_wait;
        ipIn.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)SleepOnFailure.this;
        ipIn.super_CNetAddr.m_addr._16_8_ = err_wait.__r;
        ipIn._24_16_ = local_150[0];
        CAddress::CAddress(&local_c8,ipIn,(ServiceFlags)&local_f0);
        CService::CService((CService *)&local_150[0].indirect_contents,&conn.peer);
        ipIn_00.super_CNetAddr.m_addr._union._8_8_ = SleepOnFailure.err_wait;
        ipIn_00.super_CNetAddr.m_addr._union.indirect_contents.indirect =
             (char *)SleepOnFailure.this;
        ipIn_00.super_CNetAddr.m_addr._16_8_ = err_wait.__r;
        ipIn_00._24_16_ = local_150[0];
        CAddress::CAddress(&local_128,ipIn_00,(ServiceFlags)local_150);
        CreateNodeFromAcceptedSocket(this,&conn.sock,None,&local_c8,&local_128);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_128);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                   &local_150[0].indirect_contents);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_c8);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f0);
        err_wait.__r = 1;
      }
      else {
        ThreadI2PAcceptIncoming::anon_class_16_2_853cfe4a::operator()(&SleepOnFailure);
      }
    }
    else {
      if (bVar2) {
        bVar3 = CNetAddr::IsValid(&conn.me.super_CNetAddr);
        if (bVar3) {
          RemoveLocal(&conn.me);
          bVar2 = false;
        }
      }
      ThreadI2PAcceptIncoming::anon_class_16_2_853cfe4a::operator()(&SleepOnFailure);
    }
  }
  i2p::Connection::~Connection(&conn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::ThreadI2PAcceptIncoming()
{
    static constexpr auto err_wait_begin = 1s;
    static constexpr auto err_wait_cap = 5min;
    auto err_wait = err_wait_begin;

    bool advertising_listen_addr = false;
    i2p::Connection conn;

    auto SleepOnFailure = [&]() {
        interruptNet.sleep_for(err_wait);
        if (err_wait < err_wait_cap) {
            err_wait += 1s;
        }
    };

    while (!interruptNet) {

        if (!m_i2p_sam_session->Listen(conn)) {
            if (advertising_listen_addr && conn.me.IsValid()) {
                RemoveLocal(conn.me);
                advertising_listen_addr = false;
            }
            SleepOnFailure();
            continue;
        }

        if (!advertising_listen_addr) {
            AddLocal(conn.me, LOCAL_MANUAL);
            advertising_listen_addr = true;
        }

        if (!m_i2p_sam_session->Accept(conn)) {
            SleepOnFailure();
            continue;
        }

        CreateNodeFromAcceptedSocket(std::move(conn.sock), NetPermissionFlags::None,
                                     CAddress{conn.me, NODE_NONE}, CAddress{conn.peer, NODE_NONE});

        err_wait = err_wait_begin;
    }
}